

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O2

bool UTF_u_to_U<(char)63>(UTF_US16 *us16,UTF_US32 *us32)

{
  pointer pcVar1;
  bool bVar2;
  char16_t cVar3;
  undefined8 in_RAX;
  UTF_UC32 __c;
  pointer pcVar4;
  UTF_UC32 uc32;
  char16_t local_34;
  char16_t local_32;
  
  pcVar4 = (us16->_M_dataplus)._M_p;
  pcVar1 = pcVar4 + us16->_M_string_length;
  _uc32 = in_RAX;
  do {
    if (pcVar4 == pcVar1) {
      return true;
    }
    _uc32 = CONCAT24(*pcVar4,uc32);
    if ((*pcVar4 & 0xfc00U) == 0xd800) {
      pcVar4 = pcVar4 + 1;
      if (pcVar4 == pcVar1) {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(us32,L'?');
        return true;
      }
      cVar3 = *pcVar4;
    }
    else {
      cVar3 = L'\0';
    }
    _uc32 = CONCAT26(cVar3,_uc32);
    bVar2 = UTF_uc16_to_uc32(&local_34,&uc32);
    if (bVar2) {
      __c = uc32;
    }
    else {
      _uc32 = CONCAT44(_local_34,0x3f);
      __c = L'?';
    }
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(us32,__c);
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

inline bool
UTF_u_to_U(const UTF_US16& us16, UTF_US32& us32)
{
    UTF_UC16 uc16[2];
    UTF_UC32 uc32;
    UTF_US16::const_iterator it, end = us16.end();
    for (it = us16.begin(); it != end; ++it)
    {
        if (UTF_uc16_is_surrogate_high(*it))
        {
            uc16[0] = *it;
            ++it;
            if (it == end)
            {
                if (!t_default_char)
                    return false;

                us32.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
                return true;
            }

            uc16[1] = *it;
        }
        else
        {
            uc16[0] = *it;
            uc16[1] = 0;
        }

        if (!UTF_uc16_to_uc32(uc16, &uc32))
        {
            if (!t_default_char)
                return false;

            uc32 = UTF_STATIC_CAST(UTF_UC8, t_default_char);
        }

        us32.push_back(uc32);
    }

    return true;
}